

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void * __thiscall
pstd::pmr::monotonic_buffer_resource::do_allocate
          (monotonic_buffer_resource *this,size_t bytes,size_t align)

{
  _List_node_base *p_Var1;
  bool bVar2;
  reference pvVar3;
  pointer pMVar4;
  reference pMVar5;
  _List_node_base *p_Var6;
  ulong in_RDX;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *in_RSI;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *in_RDI;
  void *ptr;
  iterator iter;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *in_stack_ffffffffffffff68;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  value_type *__x;
  _List_const_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock> local_58;
  _Self local_50;
  _Self local_48;
  undefined8 local_40;
  undefined8 local_38;
  void *local_30;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *local_28;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *local_18;
  void *local_8;
  
  local_18 = in_RSI;
  if ((list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       *)(in_RDI->
         super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
         )._M_impl._M_node._M_size < in_RSI) {
    __x = (value_type *)(in_RDI + 2);
    local_30 = memory_resource::allocate
                         ((memory_resource *)in_stack_ffffffffffffff70,
                          (size_t)in_stack_ffffffffffffff68,0x7c8d4e);
    local_28 = local_18;
    std::__cxx11::
    list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
    ::push_back(in_RDI,__x);
    pvVar3 = std::__cxx11::
             list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ::back(in_stack_ffffffffffffff70);
    local_8 = pvVar3->ptr;
  }
  else {
    if (in_RDI[1].
        super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ._M_impl._M_node._M_size % in_RDX != 0) {
      in_RDI[1].
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node._M_size =
           (in_RDX - in_RDI[1].
                     super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                     ._M_impl._M_node._M_size % in_RDX) +
           in_RDI[1].
           super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
           ._M_impl._M_node._M_size;
    }
    if (in_RDI[1].
        super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ._M_impl._M_node.super__List_node_base._M_prev <
        (_List_node_base *)
        ((long)&(in_RSI->
                super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                )._M_impl._M_node.super__List_node_base._M_next +
        in_RDI[1].
        super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ._M_impl._M_node._M_size)) {
      if (in_RDI[1].
          super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
          ._M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
        std::__cxx11::
        list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ::push_back(in_RDI,(value_type *)in_stack_ffffffffffffff78._M_node);
        local_40 = 0;
        local_38 = 0;
        in_RDI[1].
        super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        in_RDI[1].
        super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      }
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
           ::begin(in_stack_ffffffffffffff68);
      while( true ) {
        local_50._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ::end(in_stack_ffffffffffffff68);
        bVar2 = std::operator!=(&local_48,&local_50);
        if (!bVar2) break;
        in_stack_ffffffffffffff70 = local_18;
        pMVar4 = std::_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::operator->
                           ((_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock> *)
                            0x7c8e84);
        if (in_stack_ffffffffffffff70 <=
            (list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             *)pMVar4->size) {
          pMVar5 = std::_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::operator*
                             ((_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock> *)
                              0x7c8e9c);
          in_RDI[1].
          super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar5->ptr;
          in_RDI[1].
          super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
          ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pMVar5->size;
          std::_List_const_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::
          _List_const_iterator(&local_58,&local_48);
          std::__cxx11::
          list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
          ::erase(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
          goto LAB_007c8f2f;
        }
        std::_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::operator++
                  (&local_48);
      }
      p_Var6 = (_List_node_base *)
               memory_resource::allocate
                         ((memory_resource *)in_stack_ffffffffffffff70,
                          (size_t)in_stack_ffffffffffffff68,0x7c8f07);
      p_Var1 = (_List_node_base *)
               (in_RDI->
               super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
               )._M_impl._M_node._M_size;
      in_RDI[1].
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var6;
      in_RDI[1].
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node.super__List_node_base._M_prev = p_Var1;
LAB_007c8f2f:
      in_RDI[1].
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node._M_size = 0;
    }
    local_8 = (void *)((long)&(in_RDI[1].
                               super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                               ._M_impl._M_node.super__List_node_base._M_next)->_M_next +
                      in_RDI[1].
                      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                      ._M_impl._M_node._M_size);
    in_RDI[1].
    super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
    ._M_impl._M_node._M_size =
         (long)&(local_18->
                super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                )._M_impl._M_node.super__List_node_base._M_next +
         in_RDI[1].
         super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
         ._M_impl._M_node._M_size;
  }
  return local_8;
}

Assistant:

void *do_allocate(size_t bytes, size_t align) override {
        if (bytes > blockSize) {
            // We've got a big allocation; let the current block be so that
            // smaller allocations have a chance at using up more of it.
            usedBlocks.push_back(
                MemoryBlock{upstreamResource->allocate(bytes, align), bytes});
            return usedBlocks.back().ptr;
        }

        if ((currentBlockPos % align) != 0)
            currentBlockPos += align - (currentBlockPos % align);
        DCHECK_EQ(0, currentBlockPos % align);

        if (currentBlockPos + bytes > currentBlock.size) {
            // Add current block to _usedBlocks_ list
            if (currentBlock.size) {
                usedBlocks.push_back(currentBlock);
                currentBlock = {};
            }

            // Get new block of memory for _MemoryArena_

            // Try to get memory block from _availableBlocks_
            for (auto iter = availableBlocks.begin(); iter != availableBlocks.end();
                 ++iter) {
                if (bytes <= iter->size) {
                    currentBlock = std::move(*iter);
                    availableBlocks.erase(iter);
                    goto success;
                }
            }
            currentBlock = {
                upstreamResource->allocate(blockSize, alignof(std::max_align_t)),
                blockSize};
        success:
            currentBlockPos = 0;
        }

        void *ptr = (char *)currentBlock.ptr + currentBlockPos;
        currentBlockPos += bytes;
        return ptr;
    }